

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.h
# Opt level: O0

IntResult * __thiscall
slang::parsing::NumberParser::parseInteger<slang::parsing::Preprocessor,true>
          (NumberParser *this,Preprocessor *stream)

{
  Token token_00;
  Token base;
  Token size;
  Token baseToken_00;
  Token baseToken_01;
  Token sizeToken_00;
  Token sizeToken_01;
  Token first_00;
  Token first_01;
  Token sizeToken_02;
  Token baseToken_02;
  Token baseToken_03;
  Token token_01;
  int iVar1;
  SourceLocation SVar2;
  Preprocessor *in_RDX;
  long in_RSI;
  Preprocessor *in_RDI;
  bool bVar3;
  Token TVar4;
  int index;
  Token next;
  int count;
  Token first;
  anon_class_16_2_f88ffae6 createSimple;
  Token token;
  Token baseToken;
  Token sizeToken;
  bool isNegated;
  Preprocessor *in_stack_fffffffffffffde8;
  Token *in_stack_fffffffffffffdf0;
  undefined6 in_stack_fffffffffffffdf8;
  TokenKind in_stack_fffffffffffffdfe;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  Preprocessor *this_00;
  Info *in_stack_fffffffffffffe20;
  NumberParser *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  Info *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined2 in_stack_fffffffffffffec0;
  undefined6 in_stack_fffffffffffffec2;
  Info *in_stack_fffffffffffffec8;
  NumberParser *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  Info *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  Info *in_stack_ffffffffffffff00;
  TokenKind local_f8;
  NumberParser *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  Info *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff58;
  undefined2 uVar5;
  NumberParser *in_stack_ffffffffffffff60;
  Token in_stack_ffffffffffffff68;
  undefined8 local_58;
  NumberParser *local_50;
  undefined8 local_48;
  NumberParser *local_40;
  undefined8 local_38;
  NumberParser *local_30;
  
  this_00 = in_RDI;
  Preprocessor::getLastConsumed(in_RDX);
  Token::Token(in_stack_fffffffffffffdf0);
  Token::Token(in_stack_fffffffffffffdf0);
  TVar4 = Preprocessor::consume
                    ((Preprocessor *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
  local_58._0_2_ = TVar4.kind;
  bVar3 = (TokenKind)local_58 == IntegerBase;
  local_58 = TVar4._0_8_;
  local_50 = (NumberParser *)TVar4.info;
  if (bVar3) {
    local_48 = local_58;
    local_40 = local_50;
    Token::Token(in_stack_fffffffffffffdf0);
    baseToken_02.info = in_stack_ffffffffffffff00;
    baseToken_02.kind = (short)in_stack_fffffffffffffef8;
    baseToken_02._2_1_ = (char)((ulong)in_stack_fffffffffffffef8 >> 0x10);
    baseToken_02.numFlags.raw = (char)((ulong)in_stack_fffffffffffffef8 >> 0x18);
    baseToken_02.rawLen = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
    sizeToken_02.info = in_stack_fffffffffffffef0;
    sizeToken_02.kind = (short)in_stack_fffffffffffffee8;
    sizeToken_02._2_1_ = (char)((ulong)in_stack_fffffffffffffee8 >> 0x10);
    sizeToken_02.numFlags.raw = (char)((ulong)in_stack_fffffffffffffee8 >> 0x18);
    sizeToken_02.rawLen = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    startVector(in_stack_fffffffffffffee0,baseToken_02,sizeToken_02);
  }
  else {
    bVar3 = Preprocessor::peekSameLine(in_stack_fffffffffffffde8);
    if (!bVar3) {
      parseInteger<slang::parsing::Preprocessor,_true>::anon_class_16_2_f88ffae6::operator()
                ((anon_class_16_2_f88ffae6 *)in_stack_fffffffffffffe20);
      return (IntResult *)this_00;
    }
    bVar3 = Preprocessor::peek((Preprocessor *)
                               CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                               in_stack_fffffffffffffdfe);
    if (!bVar3) {
      parseInteger<slang::parsing::Preprocessor,_true>::anon_class_16_2_f88ffae6::operator()
                ((anon_class_16_2_f88ffae6 *)in_stack_fffffffffffffe20);
      return (IntResult *)this_00;
    }
    local_38 = local_58;
    local_30 = local_50;
    in_stack_ffffffffffffff68 =
         Preprocessor::consume
                   ((Preprocessor *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
    local_48 = in_stack_ffffffffffffff68._0_8_;
    local_40 = (NumberParser *)in_stack_ffffffffffffff68.info;
    baseToken_03.info = in_stack_ffffffffffffff00;
    baseToken_03.kind = (short)in_stack_fffffffffffffef8;
    baseToken_03._2_1_ = (char)((ulong)in_stack_fffffffffffffef8 >> 0x10);
    baseToken_03.numFlags.raw = (char)((ulong)in_stack_fffffffffffffef8 >> 0x18);
    baseToken_03.rawLen = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
    TVar4.info = in_stack_fffffffffffffef0;
    TVar4.kind = (short)in_stack_fffffffffffffee8;
    TVar4._2_1_ = (char)((ulong)in_stack_fffffffffffffee8 >> 0x10);
    TVar4.numFlags.raw = (char)((ulong)in_stack_fffffffffffffee8 >> 0x18);
    TVar4.rawLen = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    in_stack_ffffffffffffff58 = local_48;
    in_stack_ffffffffffffff60 = local_40;
    startVector(in_stack_fffffffffffffee0,baseToken_03,TVar4);
  }
  bVar3 = Preprocessor::peekSameLine(in_stack_fffffffffffffde8);
  if (bVar3) {
    _local_f8 = Preprocessor::peek((Preprocessor *)
                                   CONCAT26(in_stack_fffffffffffffdfe,in_stack_fffffffffffffdf8));
    bVar3 = slang::syntax::SyntaxFacts::isPossibleVectorDigit(local_f8);
    if (bVar3) {
      SVar2 = Token::location((Token *)&local_f8);
      *(SourceLocation *)(in_RSI + 0x10) = SVar2;
      do {
        token_01.info = in_stack_ffffffffffffff28;
        token_01.kind = (short)in_stack_ffffffffffffff20;
        token_01._2_1_ = (char)((ulong)in_stack_ffffffffffffff20 >> 0x10);
        token_01.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff20 >> 0x18);
        token_01.rawLen = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
        iVar1 = append(in_stack_ffffffffffffff18,token_01,local_f8._15_1_);
        Preprocessor::consume
                  ((Preprocessor *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
        uVar5 = (undefined2)((ulong)in_stack_ffffffffffffff58 >> 0x30);
        if (-1 < iVar1) {
          token_00.info = in_stack_fffffffffffffe20;
          token_00.kind = (short)in_RSI;
          token_00._2_1_ = (char)((ulong)in_RSI >> 0x10);
          token_00.numFlags.raw = (char)((ulong)in_RSI >> 0x18);
          token_00.rawLen = (int)((ulong)in_RSI >> 0x20);
          Preprocessor::handleExponentSplit(this_00,token_00,(size_t)in_RDI);
          break;
        }
        bVar3 = Preprocessor::peekSameLine(in_stack_fffffffffffffde8);
        uVar5 = (undefined2)((ulong)in_stack_ffffffffffffff58 >> 0x30);
        if (!bVar3) break;
        TVar4 = Preprocessor::peek((Preprocessor *)
                                   CONCAT26(in_stack_fffffffffffffdfe,in_stack_fffffffffffffdf8));
        bVar3 = slang::syntax::SyntaxFacts::isPossibleVectorDigit(TVar4.kind);
        in_stack_fffffffffffffe07 = false;
        if (bVar3) {
          Token::trivia((Token *)this_00);
          in_stack_fffffffffffffe07 =
               std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::empty
                         ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x24ec6f);
        }
        uVar5 = (undefined2)((ulong)in_stack_ffffffffffffff58 >> 0x30);
      } while ((bool)in_stack_fffffffffffffe07 != false);
      TVar4 = finishValue(in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,
                          SUB21((ushort)uVar5 >> 8,0),SUB21(uVar5,0));
      size.info = (Info *)local_30;
      size.kind = (undefined2)local_38;
      size._2_1_ = local_38._2_1_;
      size.numFlags.raw = local_38._3_1_;
      size.rawLen = local_38._4_4_;
      base.info = (Info *)local_40;
      base.kind = (undefined2)local_48;
      base._2_1_ = local_48._2_1_;
      base.numFlags.raw = local_48._3_1_;
      base.rawLen = local_48._4_4_;
      IntResult::vector((IntResult *)in_RDI,size,base,TVar4);
    }
    else {
      sizeToken_01.info._0_4_ = in_stack_fffffffffffffeb0;
      sizeToken_01.kind = (short)in_stack_fffffffffffffea8;
      sizeToken_01._2_1_ = (char)((ulong)in_stack_fffffffffffffea8 >> 0x10);
      sizeToken_01.numFlags.raw = (char)((ulong)in_stack_fffffffffffffea8 >> 0x18);
      sizeToken_01.rawLen = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
      sizeToken_01.info._4_4_ = in_stack_fffffffffffffeb4;
      baseToken_01.info = in_stack_fffffffffffffea0;
      baseToken_01.kind = (short)in_stack_fffffffffffffe98;
      baseToken_01._2_1_ = (char)((ulong)in_stack_fffffffffffffe98 >> 0x10);
      baseToken_01.numFlags.raw = (char)((ulong)in_stack_fffffffffffffe98 >> 0x18);
      baseToken_01.rawLen = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
      first_01._2_6_ = in_stack_fffffffffffffec2;
      first_01.kind = in_stack_fffffffffffffec0;
      first_01.info = in_stack_fffffffffffffec8;
      reportMissingDigits(in_stack_fffffffffffffe90,sizeToken_01,baseToken_01,first_01);
    }
  }
  else {
    Token::Token(in_stack_fffffffffffffdf0);
    sizeToken_00.info._0_4_ = in_stack_fffffffffffffeb0;
    sizeToken_00.kind = (short)in_stack_fffffffffffffea8;
    sizeToken_00._2_1_ = (char)((ulong)in_stack_fffffffffffffea8 >> 0x10);
    sizeToken_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffea8 >> 0x18);
    sizeToken_00.rawLen = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
    sizeToken_00.info._4_4_ = in_stack_fffffffffffffeb4;
    baseToken_00.info = in_stack_fffffffffffffea0;
    baseToken_00.kind = (short)in_stack_fffffffffffffe98;
    baseToken_00._2_1_ = (char)((ulong)in_stack_fffffffffffffe98 >> 0x10);
    baseToken_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffe98 >> 0x18);
    baseToken_00.rawLen = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
    first_00._2_6_ = in_stack_fffffffffffffec2;
    first_00.kind = in_stack_fffffffffffffec0;
    first_00.info = in_stack_fffffffffffffec8;
    reportMissingDigits(in_stack_fffffffffffffe90,sizeToken_00,baseToken_00,first_00);
  }
  return (IntResult *)this_00;
}

Assistant:

IntResult parseInteger(TStream& stream) {
        const bool isNegated = stream.getLastConsumed().kind == TokenKind::Minus;

        Token sizeToken;
        Token baseToken;

        auto token = stream.consume();
        if (token.kind == TokenKind::IntegerBase) {
            baseToken = token;
            startVector(baseToken, Token());
        }
        else {
            auto createSimple = [&] {
                checkIntOverflow(token);
                return IntResult::simple(token);
            };

            if constexpr (RequireSameLine) {
                if (!stream.peekSameLine())
                    return createSimple();
            }

            if (!stream.peek(TokenKind::IntegerBase))
                return createSimple();

            sizeToken = token;
            baseToken = stream.consume();
            startVector(baseToken, sizeToken);
        }

        if constexpr (RequireSameLine) {
            if (!stream.peekSameLine())
                return reportMissingDigits(sizeToken, baseToken, Token());
        }

        // At this point we expect to see vector digits, but they could be split out into other
        // token types because of hex literals.
        auto first = stream.peek();
        if (!syntax::SyntaxFacts::isPossibleVectorDigit(first.kind))
            return reportMissingDigits(sizeToken, baseToken, first);

        int count = 0;
        Token next = first;
        firstLocation = first.location();

        do {
            count++;
            int index = append(next, count == 1);
            stream.consume();

            if (index >= 0) {
                // This handles a really obnoxious case: 'h 3e+2
                // The second token is initially lexed as a real literal, but we need to split
                // it apart here now that we know it's a hex literal and put the remaining (new)
                // tokens back on the parser's stack.
                stream.handleExponentSplit(next, (size_t)index);

                // Bump the count so that we definitely take the modified raw text
                // instead of trying to use the initial token's raw directly.
                count++;
                break;
            }

            if constexpr (RequireSameLine) {
                if (!stream.peekSameLine())
                    break;
            }

            next = stream.peek();
        } while (syntax::SyntaxFacts::isPossibleVectorDigit(next.kind) && next.trivia().empty());

        return IntResult::vector(sizeToken, baseToken, finishValue(first, count == 1, isNegated));
    }